

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

int is_all_static_array_dimens(char *str)

{
  char *in_RAX;
  char *pcVar1;
  char *end;
  char *local_18 [3];
  
  while( true ) {
    local_18[0] = in_RAX;
    pcVar1 = strchr(str,0x5b);
    if (pcVar1 == (char *)0x0) {
      return 1;
    }
    in_RAX = (char *)strtol(pcVar1 + 1,local_18,0);
    if (*local_18[0] != ']') break;
    str = local_18[0] + 1;
  }
  return 0;
}

Assistant:

static int
is_all_static_array_dimens(const char *str)
{
    char *left_paren, *end;

    if ((left_paren = strchr(str, '[')) == NULL) {
	return 1;
    }	
    (void) strtol(left_paren + 1, &end, 0);
    if (*end != ']') {
	return 0;
    } else {
	return is_all_static_array_dimens(end+1);
    }
}